

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O1

NodePtr HighsHashTree<int,_int>::copy_recurse(NodePtr node)

{
  uint uVar1;
  long *plVar2;
  long *__dest;
  NodePtr NVar3;
  logic_error *this;
  long lVar4;
  long *plVar5;
  long *plVar6;
  long lVar7;
  ulong uVar8;
  byte bVar9;
  
  bVar9 = 0;
  switch((uint)node.ptrAndType & 7) {
  case 0:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"Unexpected node type in empty in hash tree");
    goto LAB_00272c81;
  case 1:
    plVar5 = (long *)(node.ptrAndType & 0xfffffffffffffff8);
    __dest = (long *)operator_new(0x18);
    lVar4 = plVar5[1];
    *__dest = *plVar5;
    __dest[1] = lVar4;
    __dest[2] = plVar5[2];
    plVar6 = __dest;
    do {
      plVar2 = (long *)operator_new(0x10);
      lVar4 = ((long *)*plVar5)[1];
      *plVar2 = *(long *)*plVar5;
      plVar2[1] = lVar4;
      *plVar6 = (long)plVar2;
      plVar5 = (long *)*plVar5;
      plVar6 = plVar2;
    } while (*plVar5 != 0);
    uVar8 = 1;
    break;
  case 2:
    __dest = (long *)operator_new(0x78);
    plVar5 = (long *)(node.ptrAndType & 0xfffffffffffffff8);
    plVar6 = __dest;
    for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
      *plVar6 = *plVar5;
      plVar5 = plVar5 + (ulong)bVar9 * -2 + 1;
      plVar6 = plVar6 + (ulong)bVar9 * -2 + 1;
    }
    uVar8 = 2;
    break;
  case 3:
    __dest = (long *)operator_new(0x178);
    memcpy(__dest,(void *)(node.ptrAndType & 0xfffffffffffffff8),0x178);
    uVar8 = 3;
    break;
  case 4:
    __dest = (long *)operator_new(0x278);
    memcpy(__dest,(void *)(node.ptrAndType & 0xfffffffffffffff8),0x278);
    uVar8 = 4;
    break;
  case 5:
    __dest = (long *)operator_new(0x378);
    memcpy(__dest,(void *)(node.ptrAndType & 0xfffffffffffffff8),0x378);
    uVar8 = 5;
    break;
  case 6:
    plVar5 = (long *)(node.ptrAndType & 0xfffffffffffffff8);
    lVar4 = *plVar5;
    lVar7 = POPCOUNT(lVar4);
    uVar1 = (uint)lVar7;
    __dest = (long *)operator_new((ulong)(uVar1 * 8 + 0x47 & 0xffffffc0));
    *__dest = *plVar5;
    uVar8 = 6;
    if (lVar4 != 0) {
      lVar4 = 1;
      if (1 < uVar1) {
        lVar4 = lVar7;
      }
      lVar7 = 0;
      do {
        NVar3 = copy_recurse((NodePtr)plVar5[lVar7 + 1]);
        __dest[lVar7 + 1] = NVar3.ptrAndType;
        lVar7 = lVar7 + 1;
      } while (lVar4 != lVar7);
    }
    break;
  case 7:
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"Unexpected type in hash tree");
LAB_00272c81:
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return (NodePtr)((ulong)__dest | uVar8);
}

Assistant:

static NodePtr copy_recurse(NodePtr node) {
    switch (node.getType()) {
      case kEmpty:
        throw std::logic_error("Unexpected node type in empty in hash tree");
      case kListLeaf: {
        ListLeaf* leaf = node.getListLeaf();

        ListLeaf* copyLeaf = new ListLeaf(*leaf);

        ListNode* iter = &leaf->first;
        ListNode* copyIter = &copyLeaf->first;
        do {
          copyIter->next = new ListNode(*iter->next);
          iter = iter->next;
          copyIter = copyIter->next;
        } while (iter->next != nullptr);

        return copyLeaf;
      }
      case kInnerLeafSizeClass1: {
        InnerLeaf<1>* leaf = node.getInnerLeafSizeClass1();
        return new InnerLeaf<1>(*leaf);
      }
      case kInnerLeafSizeClass2: {
        InnerLeaf<2>* leaf = node.getInnerLeafSizeClass2();
        return new InnerLeaf<2>(*leaf);
      }
      case kInnerLeafSizeClass3: {
        InnerLeaf<3>* leaf = node.getInnerLeafSizeClass3();
        return new InnerLeaf<3>(*leaf);
      }
      case kInnerLeafSizeClass4: {
        InnerLeaf<4>* leaf = node.getInnerLeafSizeClass4();
        return new InnerLeaf<4>(*leaf);
      }
      case kBranchNode: {
        BranchNode* branch = node.getBranchNode();
        int size = branch->occupation.num_set();
        BranchNode* newBranch =
            (BranchNode*)::operator new(getBranchNodeSize(size));
        newBranch->occupation = branch->occupation;
        for (int i = 0; i < size; ++i)
          newBranch->child[i] = copy_recurse(branch->child[i]);

        return newBranch;
      }
      default:
        throw std::logic_error("Unexpected type in hash tree");
    }
  }